

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_instance.cpp
# Opt level: O2

bool __thiscall LoaderInstance::ExtensionIsEnabled(LoaderInstance *this,string *extension)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  __type _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *cur_enabled;
  
  pbVar1 = (this->_enabled_extensions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = (this->_enabled_extensions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    __lhs = pbVar2;
    if (__lhs == pbVar1) break;
    _Var3 = std::operator==(__lhs,extension);
    pbVar2 = __lhs + 1;
  } while (!_Var3);
  return __lhs != pbVar1;
}

Assistant:

bool LoaderInstance::ExtensionIsEnabled(const std::string& extension) {
    for (std::string& cur_enabled : _enabled_extensions) {
        if (cur_enabled == extension) {
            return true;
        }
    }
    return false;
}